

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

int Aig_TsiStateLookup(Aig_Tsi_t *p,uint *pState,int nWords)

{
  uint *__s1;
  int iVar1;
  uint **ppuVar2;
  
  iVar1 = Aig_TsiStateHash(pState,nWords,p->nBins);
  ppuVar2 = p->pBins + iVar1;
  while( true ) {
    __s1 = *ppuVar2;
    if (__s1 == (uint *)0x0) {
      return 0;
    }
    iVar1 = bcmp(__s1,pState,(long)nWords * 4);
    if (iVar1 == 0) break;
    ppuVar2 = (uint **)(__s1 + nWords);
  }
  return 1;
}

Assistant:

int Aig_TsiStateLookup( Aig_Tsi_t * p, unsigned * pState, int nWords )
{
    unsigned * pEntry;
    int Hash;
    Hash = Aig_TsiStateHash( pState, nWords, p->nBins );
    for ( pEntry = p->pBins[Hash]; pEntry; pEntry = Aig_TsiNext(pEntry, nWords) )
        if ( !memcmp( pEntry, pState, sizeof(unsigned) * nWords ) )
            return 1;
    return 0;
}